

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void copy_rest_unit(int width,int height,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,
                   int highbd)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_ffffffffffffffd8;
  int src_stride_00;
  undefined4 in_stack_ffffffffffffffe8;
  int width_00;
  
  src_stride_00 = (int)((ulong)in_R8 >> 0x20);
  width_00 = (int)((ulong)in_RDX >> 0x20);
  if ((int)dst == 0) {
    copy_rest_unit_lowbd
              (width_00,(int)in_RDX,(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
               src_stride_00,(uint8_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),0);
  }
  else {
    copy_rest_unit_highbd
              (width_00,(int)in_RDX,(uint16_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
               src_stride_00,(uint16_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),0);
  }
  return;
}

Assistant:

static void copy_rest_unit(int width, int height, const uint8_t *src,
                           int src_stride, uint8_t *dst, int dst_stride,
                           int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    copy_rest_unit_highbd(width, height, CONVERT_TO_SHORTPTR(src), src_stride,
                          CONVERT_TO_SHORTPTR(dst), dst_stride);
    return;
  }
#endif
  (void)highbd;
  copy_rest_unit_lowbd(width, height, src, src_stride, dst, dst_stride);
}